

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

uint __thiscall
spvtools::val::Instruction::GetOperandAs<unsigned_int_const>(Instruction *this,size_t index)

{
  const_reference pvVar1;
  const_reference pvVar2;
  spv_parsed_operand_t *o;
  size_t index_local;
  Instruction *this_local;
  
  pvVar1 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::at
                     (&this->operands_,index);
  if (pvVar1->num_words == 0) {
    __assert_fail("o.num_words * 4 >= sizeof(T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/instruction.h"
                  ,0x69,
                  "T spvtools::val::Instruction::GetOperandAs(size_t) const [T = const unsigned int]"
                 );
  }
  if ((uint)pvVar1->offset + (uint)pvVar1->num_words <= (uint)(this->inst_).num_words) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->words_,(ulong)pvVar1->offset);
    return *pvVar2;
  }
  __assert_fail("o.offset + o.num_words <= inst_.num_words",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/instruction.h"
                ,0x6a,
                "T spvtools::val::Instruction::GetOperandAs(size_t) const [T = const unsigned int]")
  ;
}

Assistant:

T GetOperandAs(size_t index) const {
    const spv_parsed_operand_t& o = operands_.at(index);
    assert(o.num_words * 4 >= sizeof(T));
    assert(o.offset + o.num_words <= inst_.num_words);
    return *reinterpret_cast<const T*>(&words_[o.offset]);
  }